

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint_t __thiscall shm_test::ClientReaderThread::threadFunc(ClientReaderThread *this)

{
  int iVar1;
  ulong uVar2;
  C *pCVar3;
  uint *puVar4;
  long in_RDI;
  int newPercentage;
  ReqHdr *reply;
  size_t receivedSize;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  size_t totalSize;
  int percentage;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff60;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_38;
  ulong local_20;
  int local_14;
  uint_t local_4;
  
  local_14 = 0;
  local_20 = 0;
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x13115d);
  do {
    if (0x3ffffff < local_20) {
      printf("\nReading 100%% (done), %zd bytes\n",local_20);
      local_4 = 0;
LAB_0013133e:
      axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x131348);
      return local_4;
    }
    uVar2 = (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),&local_38)
    ;
    if (uVar2 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         (in_stack_ffffffffffffff60);
      printf("client: read error: %s\n",pCVar3);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1311de);
      local_4 = 0xffffffff;
      goto LAB_0013133e;
    }
    if (uVar2 < 8) {
      printf("client: buffer too small\n");
      local_4 = 0xffffffff;
      goto LAB_0013133e;
    }
    puVar4 = (uint *)axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(&local_38);
    if ((*puVar4 != 1) || ((ulong)puVar4[1] + 8 != uVar2)) {
      printf("client: invalid reply: %d (%d)\n",(ulong)*puVar4,(ulong)puVar4[1]);
      local_4 = 0xffffffff;
      goto LAB_0013133e;
    }
    local_20 = puVar4[1] + local_20;
    uVar2 = local_20 * 100 >> 0x1a;
    iVar1 = (int)uVar2;
    if (iVar1 != local_14) {
      local_14 = iVar1;
      printf("\b\b\b\b%d%%",uVar2 & 0xffffffff);
    }
  } while( true );
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		int percentage = 0;
		size_t totalSize = 0;

		sl::Array<char> buffer;

		while (totalSize < TotalSize) {
			size_t receivedSize = m_transport->readMessage(&buffer);
			if (receivedSize == -1) {
				printf("client: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (receivedSize < sizeof(ReqHdr)) {
				printf("client: buffer too small\n");
				return -1;
			}

			ReqHdr* reply = (ReqHdr*)buffer.cp();
			if (reply->m_code != ReqCode_Reply || sizeof(ReqHdr) + reply->m_size != receivedSize) {
				printf("client: invalid reply: %d (%d)\n", reply->m_code, reply->m_size);
				return -1;
			}

			totalSize += reply->m_size;

			int newPercentage = (uint64_t)totalSize * 100 / TotalSize;
			if (newPercentage != percentage) {
				percentage = newPercentage;
				printf("\b\b\b\b%d%%", percentage);
			}
		}

		printf("\nReading 100%% (done), %zd bytes\n", totalSize);
		return 0;
	}